

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Preferences.cxx
# Opt level: O2

void __thiscall
Fl_Preferences::Fl_Preferences(Fl_Preferences *this,char *path,char *vendor,char *application)

{
  undefined1 *puVar1;
  Node *pNVar2;
  RootNode *this_00;
  
  this->_vptr_Fl_Preferences = (_func_int **)&PTR__Fl_Plugin_Manager_00278cb8;
  pNVar2 = (Node *)operator_new(0x48);
  Node::Node(pNVar2,".");
  this->node = pNVar2;
  this_00 = (RootNode *)operator_new(0x20);
  RootNode::RootNode(this_00,this,path,vendor,application);
  this->rootNode = this_00;
  pNVar2 = this->node;
  (pNVar2->field_2).root_ = this_00;
  puVar1 = &pNVar2->field_0x30;
  *puVar1 = *puVar1 | 2;
  return;
}

Assistant:

Fl_Preferences::Fl_Preferences( const char *path, const char *vendor, const char *application ) {
  node = new Node( "." );
  rootNode = new RootNode( this, path, vendor, application );
  node->setRoot(rootNode);
}